

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O1

void deqp::egl::anon_unknown_4::renderReference
               (PixelBufferAccess *dst,
               vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
               *drawOps,PixelFormat *colorBits,int depthBits,int stencilBits,int numSamples)

{
  IVec3 *pIVar1;
  int iVar2;
  int iVar3;
  BlendMode BVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  uint uVar9;
  pointer pDVar10;
  Renderer referenceRenderer;
  TextureLevel colorBuffer;
  TextureLevel stencilBuffer;
  TextureLevel depthBuffer;
  ReferenceShader shader;
  VertexAttrib attributes [2];
  RenderTarget renderTarget;
  Renderer local_431;
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  *local_430;
  DrawCommand local_428;
  PixelBufferAccess *local_3f8;
  undefined1 local_3f0 [16];
  GeometryShader *local_3e0;
  TextureLevel local_3c8;
  RenderState local_3a0;
  TextureLevel local_2b8;
  TextureLevel local_290;
  VertexShader local_268;
  FragmentShader local_230;
  VertexAttrib local_1f8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  pointer pVStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  PixelBufferAccess local_1a0;
  PixelBufferAccess local_178;
  MultisamplePixelBufferAccess local_150;
  RenderTarget local_128;
  
  pIVar1 = &(dst->super_ConstPixelBufferAccess).m_size;
  iVar2 = pIVar1->m_data[0];
  iVar3 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  uVar7._0_4_ = pIVar1->m_data[0];
  uVar7._4_4_ = pIVar1->m_data[1];
  uVar6._0_4_ = pIVar1->m_data[0];
  uVar6._4_4_ = pIVar1->m_data[1];
  uVar5._0_4_ = pIVar1->m_data[0];
  uVar5._4_4_ = pIVar1->m_data[1];
  local_430 = drawOps;
  local_3f8 = dst;
  tcu::TextureLevel::TextureLevel(&local_3c8);
  tcu::TextureLevel::TextureLevel(&local_290);
  tcu::TextureLevel::TextureLevel(&local_2b8);
  rr::Renderer::Renderer(&local_431);
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1c8 = 0;
  pVStack_1c0 = (pointer)0x0;
  local_1f8.generic.v._8_8_ = 0;
  uStack_1d0 = 0;
  local_1f8.pointer = (pointer)0x0;
  local_1f8.generic.v._0_8_ = 0;
  local_1f8.type = VERTEXATTRIBTYPE_FLOAT;
  local_1f8.size = 0;
  local_1f8.stride = 0;
  local_1f8.instanceDivisor = 0;
  rr::VertexShader::VertexShader(&local_268,2,1);
  rr::FragmentShader::FragmentShader(&local_230,1,1);
  local_128._0_8_ = 0x300000000;
  local_268._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_003f28b0;
  local_230._vptr_FragmentShader = (_func_int **)&DAT_003f28d0;
  *(undefined8 *)
   local_268.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
   _M_impl.super__Vector_impl_data._M_start = 0;
  (local_268.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (local_268.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->flatshade = false;
  (local_230.m_inputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (local_230.m_inputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->flatshade = false;
  (local_230.m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  local_1f8.type = VERTEXATTRIBTYPE_FLOAT;
  local_1f8.size = 4;
  local_1f8.stride = 0;
  local_1f8.instanceDivisor = 0;
  uStack_1d0 = 0x400000000;
  local_1c8 = 0;
  uVar9 = colorBits->blueBits << 8 | colorBits->greenBits << 0x10 | colorBits->redBits << 0x18 |
          colorBits->alphaBits;
  uVar8 = 8;
  if ((int)uVar9 < 0x5060500) {
    if (uVar9 == 0x4040404) {
      local_128._0_8_ = 0xa00000000;
    }
    else if (uVar9 == 0x5050501) {
      local_128._0_8_ = 0xb00000000;
    }
  }
  else if (uVar9 == 0x5060500) {
    uVar8 = 7;
    local_128._0_8_ = 0x800000000;
  }
  else if (uVar9 == 0x8080800) {
    uVar8 = 7;
  }
  local_128._0_8_ = local_128._0_8_ | uVar8;
  tcu::TextureLevel::setStorage(&local_3c8,(TextureFormat *)&local_128,1,iVar2,iVar3);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_128,&local_3c8);
  local_3a0.cullMode = CULLMODE_NONE;
  local_3a0.provokingVertexConvention = PROVOKINGVERTEX_FIRST;
  local_3a0.rasterization._0_8_ = uVar5;
  rr::clearMultisampleColorBuffer
            ((PixelBufferAccess *)&local_128,(Vec4 *)CLEAR_COLOR,(WindowRectangle *)&local_3a0);
  if (0 < depthBits) {
    uVar9 = depthBits << 0x1d | (uint)depthBits >> 3;
    if (uVar9 < 4) {
      local_128._0_8_ =
           *(ulong *)(&DAT_00364288 + (ulong)uVar9 * 8) |
           *(ulong *)(&DAT_00364268 + (ulong)uVar9 * 8);
    }
    else {
      local_128._0_8_ = 0x2300000012;
    }
    tcu::TextureLevel::setStorage(&local_290,(TextureFormat *)&local_128,1,iVar2,iVar3);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_128,&local_290);
    local_3a0.cullMode = CULLMODE_NONE;
    local_3a0.provokingVertexConvention = PROVOKINGVERTEX_FIRST;
    local_3a0.rasterization._0_8_ = uVar6;
    rr::clearMultisampleDepthBuffer
              ((PixelBufferAccess *)&local_128,1.0,(WindowRectangle *)&local_3a0);
  }
  if (0 < stencilBits) {
    local_128._0_8_ = 0x1e00000013;
    tcu::TextureLevel::setStorage(&local_2b8,(TextureFormat *)&local_128,1,iVar2,iVar3);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_128,&local_2b8);
    local_3a0.cullMode = CULLMODE_NONE;
    local_3a0.provokingVertexConvention = PROVOKINGVERTEX_FIRST;
    local_3a0.rasterization._0_8_ = uVar7;
    rr::clearMultisampleStencilBuffer
              ((PixelBufferAccess *)&local_128,0,(WindowRectangle *)&local_3a0);
  }
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_428,&local_3c8);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)&local_428);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_3f0,&local_290);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_3f0);
  tcu::TextureLevel::getAccess(&local_178,&local_2b8);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_178);
  rr::RenderTarget::RenderTarget
            (&local_128,(MultisamplePixelBufferAccess *)&local_3a0,
             (MultisamplePixelBufferAccess *)&local_1a0,&local_150);
  pDVar10 = (local_430->
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pDVar10 !=
      (local_430->
      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_3f0,&local_3c8);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_3f0);
      rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                ((MultisampleConstPixelBufferAccess *)&local_428,
                 (MultisamplePixelBufferAccess *)&local_1a0);
      iVar2 = local_428.renderTarget._4_4_;
      iVar3 = (int)local_428.program;
      local_3a0.cullMode = CULLMODE_NONE;
      local_3a0.provokingVertexConvention = PROVOKINGVERTEX_LAST;
      local_3a0.rasterization.winding = WINDING_CCW;
      local_3a0.rasterization.horizontalFill = FILL_LEFT;
      local_3a0.rasterization.verticalFill = FILL_BOTTOM;
      local_3a0.rasterization.viewportOrientation = VIEWPORTORIENTATION_LAST;
      rr::FragmentOperationState::FragmentOperationState(&local_3a0.fragOps);
      local_3a0.point.pointSize = 1.0;
      local_3a0.viewport.rect.left = 0;
      local_3a0.viewport.rect.bottom = 0;
      local_3a0.viewport.rect.width = iVar2;
      local_3a0.viewport.rect.height = iVar3;
      local_3a0.viewport.zn = 0.0;
      local_3a0.viewport.zf = 1.0;
      local_3a0.line.lineWidth = 1.0;
      local_3a0.restart.enabled = false;
      local_3a0.restart.restartIndex = 0xffffffff;
      local_3a0.viewportOrientation = VIEWPORTORIENTATION_LOWER_LEFT;
      local_3a0.rasterization._8_8_ = local_3a0.rasterization._8_8_ & 0xffffffff;
      local_3a0._0_8_ = local_3a0._0_8_ & 0xffffffff00000000;
      BVar4 = pDVar10->blend;
      if (BVar4 != BLENDMODE_NONE) {
        local_3a0.fragOps.blendMode = BLENDMODE_STANDARD;
        if (BVar4 == BLENDMODE_SRC_OVER) {
          local_3a0.fragOps.blendRGBState.dstFunc = BLENDFUNC_ONE_MINUS_SRC_ALPHA;
          local_3a0.fragOps.blendRGBState.equation = BLENDEQUATION_ADD;
          local_3a0.fragOps.blendRGBState.srcFunc = BLENDFUNC_SRC_ALPHA;
        }
        else {
          if (BVar4 != BLENDMODE_ADDITIVE) goto LAB_00249dc9;
          local_3a0.fragOps.blendRGBState.dstFunc = BLENDFUNC_ONE;
          local_3a0.fragOps.blendRGBState.equation = BLENDEQUATION_ADD;
          local_3a0.fragOps.blendRGBState.srcFunc = BLENDFUNC_ONE;
        }
        local_3a0.fragOps.blendAState.dstFunc = local_3a0.fragOps.blendRGBState.dstFunc;
        local_3a0.fragOps.blendAState._0_8_ = local_3a0.fragOps.blendRGBState._0_8_;
      }
LAB_00249dc9:
      if (pDVar10->depth != DEPTHMODE_NONE) {
        local_3a0.fragOps.depthTestEnabled = true;
        local_3a0.fragOps.depthFunc = TESTFUNC_LESS;
      }
      if (pDVar10->stencil != STENCILMODE_NONE) {
        local_3a0.fragOps.stencilTestEnabled = true;
        local_3a0.fragOps.stencilStates[0].func = TESTFUNC_LEQUAL;
        local_3a0.fragOps.stencilStates[0].sFail = STENCILOP_KEEP;
        local_3a0.fragOps.stencilStates[0].dpFail = STENCILOP_INCR;
        local_3a0.fragOps.stencilStates[0].dpPass = STENCILOP_INCR;
        local_3a0.fragOps.stencilStates[0].ref = pDVar10->stencilRef;
        local_3a0.fragOps.stencilStates[1].ref = local_3a0.fragOps.stencilStates[0].ref;
        local_3a0.fragOps.stencilStates[1].func = TESTFUNC_LEQUAL;
        local_3a0.fragOps.stencilStates[1].writeMask = local_3a0.fragOps.stencilStates[0].writeMask;
        local_3a0.fragOps.stencilStates[1].dpPass = STENCILOP_INCR;
        local_3a0.fragOps.stencilStates[1].dpFail = STENCILOP_INCR;
        local_3a0.fragOps.stencilStates[1].sFail = STENCILOP_KEEP;
      }
      local_1f8.pointer =
           (pDVar10->positions).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      pVStack_1c0 = (pDVar10->colors).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_3f0._0_8_ = &local_268;
      local_3f0._8_8_ = &local_230;
      local_3e0 = (GeometryShader *)0x0;
      rr::PrimitiveList::PrimitiveList
                ((PrimitiveList *)&local_1a0,PRIMITIVETYPE_TRIANGLES,pDVar10->count * 3,0);
      local_428.state = &local_3a0;
      local_428.renderTarget = &local_128;
      local_428.program = (Program *)local_3f0;
      local_428.numVertexAttribs = 2;
      local_428.vertexAttribs = &local_1f8;
      local_428.primitives = (PrimitiveList *)&local_1a0;
      rr::Renderer::draw(&local_431,&local_428);
      pDVar10 = pDVar10 + 1;
    } while (pDVar10 !=
             (local_430->
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  tcu::TextureLevel::getAccess(&local_1a0,&local_3c8);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_1a0);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&local_3a0,
             (MultisamplePixelBufferAccess *)&local_428);
  rr::resolveMultisampleColorBuffer(local_3f8,(MultisampleConstPixelBufferAccess *)&local_3a0);
  rr::FragmentShader::~FragmentShader(&local_230);
  rr::VertexShader::~VertexShader(&local_268);
  rr::Renderer::~Renderer(&local_431);
  tcu::TextureLevel::~TextureLevel(&local_2b8);
  tcu::TextureLevel::~TextureLevel(&local_290);
  tcu::TextureLevel::~TextureLevel(&local_3c8);
  return;
}

Assistant:

void renderReference (const tcu::PixelBufferAccess& dst, const vector<DrawPrimitiveOp>& drawOps, const tcu::PixelFormat& colorBits, const int depthBits, const int stencilBits, const int numSamples)
{
	const int						width			= dst.getWidth();
	const int						height			= dst.getHeight();

	tcu::TextureLevel				colorBuffer;
	tcu::TextureLevel				depthBuffer;
	tcu::TextureLevel				stencilBuffer;

	rr::Renderer					referenceRenderer;
	rr::VertexAttrib				attributes[2];
	const ReferenceShader			shader;

	attributes[0].type				= rr::VERTEXATTRIBTYPE_FLOAT;
	attributes[0].size				= 4;
	attributes[0].stride			= 0;
	attributes[0].instanceDivisor	= 0;

	attributes[1].type				= rr::VERTEXATTRIBTYPE_FLOAT;
	attributes[1].size				= 4;
	attributes[1].stride			= 0;
	attributes[1].instanceDivisor	= 0;

	// Initialize buffers.
	colorBuffer.setStorage(getColorFormat(colorBits), numSamples, width, height);
	rr::clearMultisampleColorBuffer(colorBuffer, CLEAR_COLOR, rr::WindowRectangle(0, 0, width, height));

	if (depthBits > 0)
	{
		depthBuffer.setStorage(getDepthFormat(depthBits), numSamples, width, height);
		rr::clearMultisampleDepthBuffer(depthBuffer, CLEAR_DEPTH, rr::WindowRectangle(0, 0, width, height));
	}

	if (stencilBits > 0)
	{
		stencilBuffer.setStorage(getStencilFormat(stencilBits), numSamples, width, height);
		rr::clearMultisampleStencilBuffer(stencilBuffer, CLEAR_STENCIL, rr::WindowRectangle(0, 0, width, height));
	}

	const rr::RenderTarget renderTarget(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer.getAccess()),
										rr::MultisamplePixelBufferAccess::fromMultisampleAccess(depthBuffer.getAccess()),
										rr::MultisamplePixelBufferAccess::fromMultisampleAccess(stencilBuffer.getAccess()));

	for (vector<DrawPrimitiveOp>::const_iterator drawOp = drawOps.begin(); drawOp != drawOps.end(); drawOp++)
	{
		// Translate state
		rr::RenderState renderState((rr::ViewportState)(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer.getAccess())));
		toReferenceRenderState(renderState, *drawOp);

		DE_ASSERT(drawOp->type == PRIMITIVETYPE_TRIANGLE);

		attributes[0].pointer = &drawOp->positions[0];
		attributes[1].pointer = &drawOp->colors[0];

		referenceRenderer.draw(
			rr::DrawCommand(
				renderState,
				renderTarget,
				rr::Program(static_cast<const rr::VertexShader*>(&shader), static_cast<const rr::FragmentShader*>(&shader)),
				2,
				attributes,
				rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, drawOp->count * 3, 0)));
	}

	rr::resolveMultisampleColorBuffer(dst, rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer.getAccess()));
}